

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

void __thiscall QString::QString(QString *this,QChar *unicode,qsizetype size)

{
  QArrayData *data;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (this->d).d = (Data *)0x0;
  (this->d).ptr = (char16_t *)0x0;
  (this->d).size = 0;
  if (unicode == (QChar *)0x0) {
    data = &((this->d).d)->super_QArrayData;
    (this->d).d = (Data *)0x0;
    (this->d).ptr = (char16_t *)0x0;
    (this->d).size = 0;
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          QArrayData::deallocate(data,2,0x10);
          return;
        }
        goto LAB_0011e552;
      }
    }
  }
  else {
    if (size < 0) {
      size = QtPrivate::qustrlen(&unicode->ucs);
    }
    if (size == 0) {
      local_40.d = (Data *)0x0;
      local_40.ptr = L"";
      local_40.size = 0;
      QArrayDataPointer<char16_t>::operator=(&this->d,&local_40);
      if (&(local_40.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_40.d)->super_QArrayData,2,0x10);
        }
      }
    }
    else {
      local_40.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_40.ptr = (char16_t *)QArrayData::allocate2((QArrayData **)&local_40,size,KeepSize);
      local_40.size = size;
      QArrayDataPointer<char16_t>::operator=(&this->d,&local_40);
      if (&(local_40.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_40.d)->super_QArrayData,2,0x10);
        }
      }
      memcpy((this->d).ptr,unicode,size * 2);
      (this->d).ptr[size] = L'\0';
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_0011e552:
  __stack_chk_fail();
}

Assistant:

QString::QString(const QChar *unicode, qsizetype size)
{
    if (!unicode) {
        d.clear();
    } else {
        if (size < 0)
            size = QtPrivate::qustrlen(reinterpret_cast<const char16_t *>(unicode));
        if (!size) {
            d = DataPointer::fromRawData(&_empty, 0);
        } else {
            d = DataPointer(size, size);
            Q_CHECK_PTR(d.data());
            memcpy(d.data(), unicode, size * sizeof(QChar));
            d.data()[size] = '\0';
        }
    }
}